

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O0

void __thiscall
optimization::remove_dead_code::Remove_Dead_Code::optimize_func
          (Remove_Dead_Code *this,string *funcId,MirFunction *func)

{
  bool bVar1;
  iterator iter;
  bool modify;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_00000128;
  BasicBlk *in_stack_00000130;
  shared_ptr<optimization::livevar_analyse::Block_Live_Var> *in_stack_00000138;
  Remove_Dead_Code *in_stack_00000140;
  element_type *in_stack_ffffffffffffff68;
  shared_ptr<optimization::livevar_analyse::Livevar_Analyse> *in_stack_ffffffffffffff70;
  shared_ptr<optimization::livevar_analyse::Block_Live_Var> *this_00;
  int iVar2;
  _Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *this_01;
  MirFunction *in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffa0;
  _Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_48;
  shared_ptr<optimization::livevar_analyse::Block_Live_Var> local_40 [4];
  
  std::make_shared<optimization::livevar_analyse::Livevar_Analyse,mir::inst::MirFunction&>
            (in_stack_ffffffffffffff98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8._M_node);
  std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>::operator=
            (in_stack_ffffffffffffff70,
             (shared_ptr<optimization::livevar_analyse::Livevar_Analyse> *)in_stack_ffffffffffffff68
            );
  std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>::~shared_ptr
            ((shared_ptr<optimization::livevar_analyse::Livevar_Analyse> *)0x1430a6);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8._M_node);
  std::
  __shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1430c1);
  livevar_analyse::Livevar_Analyse::build((Livevar_Analyse *)in_stack_ffffffffffffffa0._M_node);
  while( true ) {
    local_40[0].
    super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    local_40[0].
    super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_ffffffffffffff68);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_ffffffffffffff68);
      bVar1 = std::operator!=((_Self *)local_40,&local_48);
      if (!bVar1) break;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
      ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8._M_node);
      in_stack_ffffffffffffff68 =
           std::
           __shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14312d);
      this_00 = local_40;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x143140);
      std::
      map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
      ::operator[]((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                    *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8._M_node);
      this_01 = (_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                &stack0xffffffffffffffa8;
      std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::shared_ptr
                (this_00,(shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                         in_stack_ffffffffffffff68);
      iVar2 = (int)((ulong)this_00 >> 0x20);
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x143168);
      bVar1 = remove_dead_code(in_stack_00000140,in_stack_00000138,in_stack_00000130,
                               in_stack_00000128);
      local_40[0].
      super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._3_1_ =
           (local_40[0].
            super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._3_1_ & 1) != 0 || bVar1;
      std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::~shared_ptr
                ((shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)0x1431ba);
      in_stack_ffffffffffffffa0 =
           std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                     (this_01,iVar2);
    }
    if ((local_40[0].
         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._3_1_ & 1) == 0) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
    ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8._M_node);
    std::
    __shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x143228);
    livevar_analyse::Livevar_Analyse::build((Livevar_Analyse *)in_stack_ffffffffffffffa0._M_node);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    func_livevar_analyse[funcId] =
        std::make_shared<livevar_analyse::Livevar_Analyse>(func);
    func_livevar_analyse[funcId]->build();
    while (true) {  // delete death code for each block and build again util no
                    // death code to remove
      bool modify = false;
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           iter++) {
        modify |= remove_dead_code(
            func_livevar_analyse[funcId]->livevars[iter->first], iter->second,
            func.variables);
      }
      if (!modify) {
        break;
      }
      func_livevar_analyse[funcId]->build();
    }
  }